

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.hpp
# Opt level: O3

void __thiscall KmerCounter::KmerCounter(KmerCounter *this,WorkSpace *_ws,string *filename)

{
  ifstream count_file;
  ifstream aiStack_238 [520];
  
  (this->counts).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->counts).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->count_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->counts).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->count_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->count_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->kindex128).super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->kindex128).super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->kindex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->kindex128).super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->kindex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->kindex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->ws = _ws;
  this->kci_peak_f = -1.0;
  (this->kci_cache)._M_h._M_buckets = &(this->kci_cache)._M_h._M_single_bucket;
  (this->kci_cache)._M_h._M_bucket_count = 1;
  (this->kci_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->kci_cache)._M_h._M_element_count = 0;
  (this->kci_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->kci_cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->kci_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->kci_cache128)._M_h._M_buckets = &(this->kci_cache128)._M_h._M_single_bucket;
  (this->kci_cache128)._M_h._M_bucket_count = 1;
  (this->kci_cache128)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->kci_cache128)._M_h._M_element_count = 0;
  (this->kci_cache128)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->kci_cache128)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->kci_cache128)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::ifstream::ifstream(aiStack_238,(string *)filename,_S_in);
  read_counts(this,aiStack_238);
  std::ifstream::~ifstream(aiStack_238);
  return;
}

Assistant:

KmerCounter (const WorkSpace &_ws, const std::string &filename):ws(_ws) {
        std::ifstream count_file(filename);
        read_counts(count_file);
    }